

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

bool __thiscall
SGParser::Parse<SGParser::ParseStackGenericElement>::Create
          (Parse<SGParser::ParseStackGenericElement> *this,ParseTable *ptable,size_t stackSize)

{
  long *plVar1;
  uint uVar2;
  size_t *psVar3;
  size_t sVar4;
  long *plVar5;
  size_t *psVar6;
  ParseStackGenericElement *pPVar7;
  size_t sVar8;
  long lVar9;
  
  uVar2 = this->TopState;
  if (uVar2 == 0xffffffff) {
    sVar8 = 0x80;
    if (0x80 < stackSize) {
      sVar8 = stackSize;
    }
    psVar6 = (size_t *)operator_new__(-(ulong)(stackSize >> 0x3a != 0) | sVar8 * 0x40 | 8);
    *psVar6 = sVar8;
    pPVar7 = (ParseStackGenericElement *)(psVar6 + 1);
    do {
      (pPVar7->super_ParseStackElement<SGParser::GenericToken>).State = 0xffffffff;
      (pPVar7->super_ParseStackElement<SGParser::GenericToken>).TerminalMarker = 0xffffffffffffffff;
      (pPVar7->Str)._M_dataplus._M_p = (pointer)&(pPVar7->Str).field_2;
      (pPVar7->Str)._M_string_length = 0;
      (pPVar7->Str).field_2._M_local_buf[0] = '\0';
      pPVar7->Line = 0;
      pPVar7->Offset = 0;
      pPVar7 = pPVar7 + 1;
    } while (pPVar7 != (ParseStackGenericElement *)(psVar6 + sVar8 * 8 + 1));
    psVar3 = this->pValidTokenStackPositions;
    this->pValidTokenStackPositions = (size_t *)0x0;
    if (psVar3 != (size_t *)0x0) {
      operator_delete__(psVar3);
    }
    this->pParseTable = ptable;
    this->pTokenizer = (TokenStream<SGParser::GenericToken> *)0x0;
    this->TopState = 0xffffffff;
    this->ErrorMarker = 0xffffffffffffffff;
    pPVar7 = this->pStack;
    this->pStack = (ParseStackGenericElement *)(psVar6 + 1);
    if (pPVar7 != (ParseStackGenericElement *)0x0) {
      sVar4 = pPVar7[-1].Offset;
      if (sVar4 != 0) {
        lVar9 = sVar4 << 6;
        do {
          plVar1 = (long *)((long)pPVar7 + lVar9 + -0x20);
          plVar5 = *(long **)((long)pPVar7 + lVar9 + -0x30);
          if (plVar1 != plVar5) {
            operator_delete(plVar5,*plVar1 + 1);
          }
          lVar9 = lVar9 + -0x40;
        } while (lVar9 != 0);
      }
      operator_delete__(&pPVar7[-1].Offset,sVar4 << 6 | 8);
    }
    this->StackSize = sVar8;
    this->StackPosition = 0;
  }
  return uVar2 == 0xffffffff;
}

Assistant:

bool Parse<StackElement>::Create(const ParseTable* ptable, size_t stackSize) {
    // Make sure the parsing process is not started
    // IsValid() is reversed in this context: `this` is valid for Create
    // only if IsValid() is false
    if (IsValid())
        return false;

    // Allocate stack
    // Basic exception safety is provided
    const auto newStackSize = std::max(MinStackSize, stackSize);
    auto       newStack     = new StackElement[newStackSize];

    // From this point we can (safely) initialize the actual data

    delete[] std::exchange(pValidTokenStackPositions, nullptr);

    pParseTable = ptable;
    pTokenizer  = nullptr;
    TopState    = InvalidState;
    ErrorMarker = InvalidIndex;

    // If new stack allocation is successful then modify the existing stack
    delete[] std::exchange(pStack, newStack);
    StackSize     = newStackSize;
    StackPosition = 0u;

    return true;
}